

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O0

void WriteArrayVars(FSerializer *file,FWorldGlobalArray *vars,uint count,char *key)

{
  bool bVar1;
  hash_t hVar2;
  char *pcVar3;
  uint local_64;
  ConstPair *pCStack_60;
  int v;
  Pair *pair;
  ConstIterator it;
  FString local_38;
  FString arraykey;
  uint i;
  char *key_local;
  uint count_local;
  FWorldGlobalArray *vars_local;
  FSerializer *file_local;
  
  arraykey.Chars._4_4_ = 0;
  while ((arraykey.Chars._4_4_ < count &&
         (hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed
                            (vars + arraykey.Chars._4_4_), hVar2 == 0))) {
    arraykey.Chars._4_4_ = arraykey.Chars._4_4_ + 1;
  }
  if ((arraykey.Chars._4_4_ < count) && (bVar1 = FSerializer::BeginObject(file,key), bVar1)) {
    for (; arraykey.Chars._4_4_ < count; arraykey.Chars._4_4_ = arraykey.Chars._4_4_ + 1) {
      hVar2 = TMap<int,_int,_THashTraits<int>,_InitIntToZero>::CountUsed
                        (vars + arraykey.Chars._4_4_);
      if (hVar2 != 0) {
        FString::FString(&local_38);
        FString::Format(&local_38,"%d",(ulong)arraykey.Chars._4_4_);
        pcVar3 = FString::operator_cast_to_char_(&local_38);
        bVar1 = FSerializer::BeginObject(file,pcVar3);
        if (bVar1) {
          TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>::
          TMapConstIterator((TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>
                             *)&pair,vars + arraykey.Chars._4_4_);
          while (bVar1 = TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>
                         ::NextPair((TMapConstIterator<int,_int,_TMap<int,_int,_THashTraits<int>,_InitIntToZero>_>
                                     *)&pair,&stack0xffffffffffffffa0), bVar1) {
            FString::Format(&local_38,"%d",(ulong)(uint)pCStack_60->Key);
            local_64 = pCStack_60->Value;
            pcVar3 = FString::GetChars(&local_38);
            FSerializer::operator()(file,pcVar3,(int *)&local_64);
          }
          FSerializer::EndObject(file);
        }
        FString::~FString(&local_38);
      }
    }
    FSerializer::EndObject(file);
  }
  return;
}

Assistant:

static void WriteArrayVars (FSerializer &file, FWorldGlobalArray *vars, unsigned int count, const char *key)
{
	unsigned int i;

	// Find the first non-empty array.
	for (i = 0; i < count; ++i)
	{
		if (vars[i].CountUsed() != 0)
			break;
	}
	if (i < count)
	{
		if (file.BeginObject(key))
		{
			for(;i<count;i++)
			{
				if (vars[i].CountUsed())
				{
					FString arraykey;

					arraykey.Format("%d", i);
					if (file.BeginObject(arraykey))
					{
						FWorldGlobalArray::ConstIterator it(vars[i]);
						const FWorldGlobalArray::Pair *pair;

						while (it.NextPair(pair))
						{
							arraykey.Format("%d", pair->Key);
							int v = pair->Value;
							file(arraykey.GetChars(), v);
						}
						file.EndObject();
					}
				}
			}
			file.EndObject();
		}
	}
}